

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O3

CSVReaderOptions * __thiscall
duckdb::CSVReaderOptions::operator=(CSVReaderOptions *this,CSVReaderOptions *param_1)

{
  unsigned_long uVar1;
  idx_t iVar2;
  CSVOption<char> CVar3;
  CSVOption<char> CVar4;
  CSVOption<duckdb::NewLineIdentifier> CVar5;
  undefined7 uVar6;
  CSVOption<bool> CVar7;
  bool bVar8;
  
  (this->dialect_options).state_machine_options.delimiter.set_by_user =
       (param_1->dialect_options).state_machine_options.delimiter.set_by_user;
  ::std::__cxx11::string::_M_assign
            ((string *)&(this->dialect_options).state_machine_options.delimiter.value);
  (this->dialect_options).state_machine_options.strict_mode =
       (param_1->dialect_options).state_machine_options.strict_mode;
  CVar3 = (param_1->dialect_options).state_machine_options.escape;
  CVar4 = (param_1->dialect_options).state_machine_options.comment;
  CVar5 = (param_1->dialect_options).state_machine_options.new_line;
  (this->dialect_options).state_machine_options.quote =
       (param_1->dialect_options).state_machine_options.quote;
  (this->dialect_options).state_machine_options.escape = CVar3;
  (this->dialect_options).state_machine_options.comment = CVar4;
  (this->dialect_options).state_machine_options.new_line = CVar5;
  (this->dialect_options).num_cols = (param_1->dialect_options).num_cols;
  (this->dialect_options).header = (param_1->dialect_options).header;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::operator=(&(this->dialect_options).date_format._M_t,&(param_1->dialect_options).date_format._M_t
             );
  uVar6 = *(undefined7 *)&(param_1->dialect_options).skip_rows.field_0x1;
  uVar1 = (param_1->dialect_options).skip_rows.value;
  (this->dialect_options).skip_rows.set_by_user = (param_1->dialect_options).skip_rows.set_by_user;
  *(undefined7 *)&(this->dialect_options).skip_rows.field_0x1 = uVar6;
  (this->dialect_options).skip_rows.value = uVar1;
  (this->dialect_options).rows_until_header = (param_1->dialect_options).rows_until_header;
  CVar7 = param_1->store_rejects;
  this->ignore_errors = param_1->ignore_errors;
  this->store_rejects = CVar7;
  (this->rejects_table_name).set_by_user = (param_1->rejects_table_name).set_by_user;
  ::std::__cxx11::string::_M_assign((string *)&(this->rejects_table_name).value);
  (this->rejects_scan_name).set_by_user = (param_1->rejects_scan_name).set_by_user;
  ::std::__cxx11::string::_M_assign((string *)&(this->rejects_scan_name).value);
  iVar2 = param_1->buffer_sample_size;
  this->rejects_limit = param_1->rejects_limit;
  this->buffer_sample_size = iVar2;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->null_str,
              &(param_1->null_str).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  bVar8 = param_1->allow_quoted_nulls;
  this->compression = param_1->compression;
  this->allow_quoted_nulls = bVar8;
  this->comment = param_1->comment;
  if (param_1 != this) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->sql_types_per_column,&(param_1->sql_types_per_column)._M_h);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->sql_type_list,
             &(param_1->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->name_list,
              &(param_1->name_list).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this->columns_set = param_1->columns_set;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->auto_type_candidates,
             &(param_1->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::__cxx11::string::_M_assign((string *)&this->sniffer_user_mismatch_error);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            (&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>,
             &(param_1->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>);
  uVar6 = *(undefined7 *)&(param_1->maximum_line_size).field_0x1;
  uVar1 = (param_1->maximum_line_size).value;
  (this->maximum_line_size).set_by_user = (param_1->maximum_line_size).set_by_user;
  *(undefined7 *)&(this->maximum_line_size).field_0x1 = uVar6;
  (this->maximum_line_size).value = uVar1;
  this->normalize_names = param_1->normalize_names;
  if (param_1 != this) {
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->force_not_null_names,&(param_1->force_not_null_names)._M_h);
  }
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            (&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>,
             &(param_1->force_not_null).super_vector<bool,_std::allocator<bool>_>);
  this->sample_size_chunks = param_1->sample_size_chunks;
  bVar8 = param_1->auto_detect;
  this->all_varchar = param_1->all_varchar;
  this->auto_detect = bVar8;
  ::std::__cxx11::string::_M_assign((string *)&this->file_path);
  uVar6 = *(undefined7 *)&(param_1->buffer_size_option).field_0x1;
  uVar1 = (param_1->buffer_size_option).value;
  (this->buffer_size_option).set_by_user = (param_1->buffer_size_option).set_by_user;
  *(undefined7 *)&(this->buffer_size_option).field_0x1 = uVar6;
  (this->buffer_size_option).value = uVar1;
  ::std::__cxx11::string::_M_assign((string *)&this->decimal_separator);
  bVar8 = param_1->parallel;
  this->null_padding = param_1->null_padding;
  this->parallel = bVar8;
  ::std::__cxx11::string::_M_assign((string *)&this->encoding);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->user_defined_parameters)._M_t,&(param_1->user_defined_parameters)._M_t);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            (&(this->force_quote).super_vector<bool,_std::allocator<bool>_>,
             &(param_1->force_quote).super_vector<bool,_std::allocator<bool>_>);
  ::std::__cxx11::string::_M_assign((string *)&this->prefix);
  ::std::__cxx11::string::_M_assign((string *)&this->suffix);
  ::std::__cxx11::string::_M_assign((string *)&this->write_newline);
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::operator=(&(this->write_date_format)._M_t,&(param_1->write_date_format)._M_t);
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_bool>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_bool>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::operator=(&(this->has_format)._M_t,&(param_1->has_format)._M_t);
  this->multi_file_reader = param_1->multi_file_reader;
  return this;
}

Assistant:

CSVReaderOptions() {
	}